

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

uint32_t get_rng_seed(uint32_t seed)

{
  int iVar1;
  double dVar2;
  random_device rd;
  random_device rStack_1398;
  
  if (seed == 0xffffffff) {
    if (get_rng_seed(unsigned_int)::is_rd_prng == '\0') {
      iVar1 = __cxa_guard_acquire(&get_rng_seed(unsigned_int)::is_rd_prng);
      if (iVar1 != 0) {
        std::random_device::random_device(&rStack_1398);
        dVar2 = (double)std::random_device::_M_getentropy();
        std::random_device::~random_device(&rStack_1398);
        get_rng_seed::is_rd_prng = dVar2 == 0.0;
        __cxa_guard_release(&get_rng_seed(unsigned_int)::is_rd_prng);
      }
    }
    if (get_rng_seed::is_rd_prng == true) {
      seed = std::chrono::_V2::system_clock::now();
    }
    else {
      std::random_device::random_device(&rStack_1398);
      seed = std::random_device::_M_getval();
      std::random_device::~random_device(&rStack_1398);
    }
  }
  return seed;
}

Assistant:

static uint32_t get_rng_seed(uint32_t seed) {
    if (seed == LLAMA_DEFAULT_SEED) {
        // use system clock if std::random_device is not a true RNG
        static bool is_rd_prng = std::random_device().entropy() == 0;
        if (is_rd_prng) {
            return (uint32_t) std::chrono::system_clock::now().time_since_epoch().count();
        }
        std::random_device rd;
        return rd();
    }
    return seed;
}